

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlParserCtxtPtr xmlCreateDocParserCtxt(xmlChar *str)

{
  int iVar1;
  xmlParserCtxtPtr ctxt;
  xmlParserInputPtr value;
  
  ctxt = xmlNewParserCtxt();
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    value = xmlCtxtNewInputFromString(ctxt,(char *)0x0,(char *)str,(char *)0x0,0);
    if (value != (xmlParserInputPtr)0x0) {
      iVar1 = xmlCtxtPushInput(ctxt,value);
      if (-1 < iVar1) {
        return ctxt;
      }
      xmlFreeInputStream(value);
    }
    xmlFreeParserCtxt(ctxt);
  }
  return (xmlParserCtxtPtr)0x0;
}

Assistant:

xmlParserCtxtPtr
xmlCreateDocParserCtxt(const xmlChar *str) {
    xmlParserCtxtPtr ctxt;
    xmlParserInputPtr input;

    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL)
	return(NULL);

    input = xmlCtxtNewInputFromString(ctxt, NULL, (const char *) str, NULL, 0);
    if (input == NULL) {
	xmlFreeParserCtxt(ctxt);
	return(NULL);
    }
    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        xmlFreeParserCtxt(ctxt);
        return(NULL);
    }

    return(ctxt);
}